

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O1

void __thiscall cs::event_type::event_type(event_type *this,listener_type *default_listener)

{
  (this->m_listener).m_start = (function<bool_(void_*)> *)0x0;
  (this->m_listener).m_current = (function<bool_(void_*)> *)0x0;
  (this->m_listener).m_data = (aligned_type *)0x0;
  (this->m_listener).m_size = 0;
  stack_type<std::function<bool_(void_*)>,_std::allocator>::resize(&this->m_listener,0x200);
  stack_type<std::function<bool(void*)>,std::allocator>::push<std::function<bool(void*)>>
            ((stack_type<std::function<bool(void*)>,std::allocator> *)this,default_listener);
  return;
}

Assistant:

explicit event_type(listener_type default_listener)
		{
			m_listener.push(std::move(default_listener));
		}